

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb<char,_false,_5>_> __thiscall
immutable::rrb_push<char,false,5>
          (immutable *this,ref<immutable::rrb<char,_false,_5>_> *in,char element)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  tree_node<char,_false> *ptVar3;
  leaf_node<char,_false> *plVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined4 uVar7;
  rrb<char,_false,_5> *prVar8;
  ref<immutable::rrb<char,_false,_5>_> new_rrb;
  ref<immutable::rrb_details::leaf_node<char,_false>_> new_tail;
  ref<immutable::rrb<char,_false,_5>_> local_30;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_28;
  
  prVar8 = in->ptr;
  if (prVar8 != (rrb<char,_false,_5> *)0x0) {
    if (prVar8->tail_len < 0x20) {
      prVar8 = rrb_details::rrb_tail_push<char,false,5>(in,element);
      *(rrb<char,_false,_5> **)this = prVar8;
      if (prVar8 != (rrb<char,_false,_5> *)0x0) {
        prVar8->_ref_count = 1;
      }
      return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
    }
    local_30.ptr = (rrb<char,_false,_5> *)malloc(0x28);
    uVar2 = prVar8->cnt;
    uVar5 = prVar8->shift;
    uVar6 = prVar8->tail_len;
    uVar7 = *(undefined4 *)&prVar8->field_0xc;
    ptVar3 = (prVar8->root).ptr;
    ((local_30.ptr)->tail).ptr = (prVar8->tail).ptr;
    ((local_30.ptr)->root).ptr = ptVar3;
    (local_30.ptr)->cnt = uVar2;
    (local_30.ptr)->shift = uVar5;
    (local_30.ptr)->tail_len = uVar6;
    *(undefined4 *)&(local_30.ptr)->field_0xc = uVar7;
    uVar7 = *(undefined4 *)&prVar8->field_0x24;
    (local_30.ptr)->_ref_count = prVar8->_ref_count;
    *(undefined4 *)&(local_30.ptr)->field_0x24 = uVar7;
    ptVar3 = ((local_30.ptr)->root).ptr;
    if (ptVar3 != (tree_node<char,_false> *)0x0) {
      puVar1 = &ptVar3->_ref_count;
      *puVar1 = *puVar1 + 1;
    }
    plVar4 = ((local_30.ptr)->tail).ptr;
    if (plVar4 != (leaf_node<char,_false> *)0x0) {
      puVar1 = &plVar4->_ref_count;
      *puVar1 = *puVar1 + 1;
    }
    if (local_30.ptr != (rrb<char,_false,_5> *)0x0) {
      (local_30.ptr)->_ref_count = 1;
      (local_30.ptr)->cnt = (local_30.ptr)->cnt + 1;
      local_28.ptr = (leaf_node<char,_false> *)malloc(0x19);
      (local_28.ptr)->type = LEAF_NODE;
      (local_28.ptr)->len = 1;
      (local_28.ptr)->child = (char *)(local_28.ptr + 1);
      (local_28.ptr)->guid = 0;
      *(undefined1 *)&local_28.ptr[1].type = LEAF_NODE;
      (local_28.ptr)->_ref_count = 1;
      *(local_28.ptr)->child = element;
      if (local_30.ptr != (rrb<char,_false,_5> *)0x0) {
        (local_30.ptr)->tail_len = 1;
        rrb_details::push_down_tail<char,false,5>((rrb_details *)this,in,&local_30,&local_28);
        if ((local_28.ptr != (leaf_node<char,_false> *)0x0) &&
           (uVar2 = (local_28.ptr)->_ref_count, (local_28.ptr)->_ref_count = uVar2 - 1, uVar2 == 1))
        {
          free(local_28.ptr);
        }
        ref<immutable::rrb<char,_false,_5>_>::~ref(&local_30);
        return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
      }
    }
  }
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,
                "T *immutable::ref<immutable::rrb<char, false>>::operator->() const [T = immutable::rrb<char, false>]"
               );
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }